

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

Error __thiscall
asmjit::Assembler::_emitFailed
          (Assembler *this,Error err,uint32_t instId,uint32_t options,Operand_ *o0,Operand_ *o1,
          Operand_ *o2,Operand_ *o3)

{
  Error EVar1;
  uint in_ECX;
  CodeEmitter *in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  Operand_ opArray [6];
  StringBuilderTmp<256UL> sb;
  undefined8 in_stack_fffffffffffffc70;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffc7c;
  size_t in_stack_fffffffffffffc80;
  undefined1 **ppuVar3;
  uint32_t in_stack_fffffffffffffc88;
  uint32_t in_stack_fffffffffffffc8c;
  undefined4 in_stack_fffffffffffffc98;
  uint32_t in_stack_fffffffffffffc9c;
  StringBuilder *in_stack_fffffffffffffca0;
  undefined8 local_358;
  undefined8 local_338;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  CodeEmitter *local_318;
  undefined8 local_310;
  undefined8 local_308;
  undefined8 local_300;
  undefined1 *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8 [264];
  undefined8 *local_1d0;
  undefined8 *local_1c8;
  uint local_1bc;
  undefined8 *local_1a8;
  CodeEmitter **local_1a0;
  undefined1 **local_198;
  undefined1 **local_190;
  undefined8 local_180;
  char *local_178;
  undefined1 **local_170;
  undefined8 local_168;
  char *local_160;
  undefined1 **local_158;
  uint32_t *local_150;
  undefined8 *local_148;
  CodeEmitter **local_140;
  CodeEmitter **local_138;
  undefined8 *local_130;
  undefined8 *local_128;
  undefined8 *local_118;
  undefined8 *local_110;
  undefined1 *local_108;
  undefined8 *local_100;
  undefined8 *local_f8;
  undefined4 local_d8;
  undefined4 local_d4;
  CodeEmitter **local_d0;
  undefined4 local_c8;
  undefined4 local_c4;
  undefined8 *local_c0;
  undefined4 local_b8;
  undefined4 local_b4;
  CodeEmitter **local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 *local_a0;
  undefined4 local_98;
  undefined4 local_94;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 *local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined8 *local_70;
  undefined4 local_68;
  undefined4 local_64;
  CodeEmitter **local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  CodeInfo *local_30;
  CodeInfo *local_28;
  undefined4 local_1c;
  Operand_ *local_18;
  undefined1 *local_10;
  undefined1 **local_8;
  
  local_198 = &local_2f8;
  local_10 = &NoInit;
  local_2f8 = local_2d8;
  local_2d8[0] = 0;
  local_2f0 = 0;
  local_2e8 = 0x100;
  local_2e0 = 0;
  local_1d0 = in_R9;
  local_1c8 = in_R8;
  local_1bc = in_ECX;
  local_8 = local_198;
  local_160 = DebugUtils::errorAsString((Error)((ulong)in_stack_fffffffffffffc70 >> 0x20));
  local_158 = &local_2f8;
  local_168 = 0xffffffffffffffff;
  StringBuilder::_opString
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
             (uint32_t)((ulong)in_RDI >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             in_stack_fffffffffffffc80);
  local_170 = &local_2f8;
  local_178 = ": ";
  local_180 = 0xffffffffffffffff;
  StringBuilder::_opString
            ((StringBuilder *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98),
             (uint32_t)((ulong)in_RDI >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             in_stack_fffffffffffffc80);
  local_f8 = &local_358;
  local_100 = local_1c8;
  local_358 = *local_1c8;
  local_108 = &stack0xfffffffffffffcb8;
  local_110 = local_1d0;
  local_118 = &local_338;
  local_338 = *in_stack_00000008;
  local_330 = in_stack_00000008[1];
  local_128 = &local_328;
  local_130 = in_stack_00000010;
  local_328 = *in_stack_00000010;
  local_320 = in_stack_00000010[1];
  if ((local_1bc & 8) == 0) {
    local_1a0 = &local_318;
    local_d4 = 0;
    local_d8 = 0;
    local_64 = 0;
    local_68 = 0;
    local_54 = 0;
    local_58 = 0;
    local_318 = (CodeEmitter *)0x0;
    local_b4 = 0;
    local_b8 = 0;
    local_80 = &local_310;
    local_84 = 0;
    local_88 = 0;
    local_44 = 0;
    local_48 = 0;
    local_310 = 0;
    local_1a8 = &local_308;
    local_c4 = 0;
    local_c8 = 0;
    local_74 = 0;
    local_78 = 0;
    local_4c = 0;
    local_50 = 0;
    local_308 = 0;
    local_a4 = 0;
    local_a8 = 0;
    local_90 = &local_300;
    local_94 = 0;
    local_98 = 0;
    local_3c = 0;
    local_40 = 0;
    local_300 = 0;
    local_d0 = local_1a0;
    local_c0 = local_1a8;
    local_b0 = local_1a0;
    local_a0 = local_1a8;
    local_70 = local_1a8;
    local_60 = local_1a0;
  }
  else {
    local_138 = &local_318;
    local_140 = &in_RDI[1]._nextEmitter;
    local_318 = *local_140;
    local_310._0_1_ = in_RDI[1]._type;
    local_310._1_1_ = in_RDI[1]._destroyed;
    local_310._2_1_ = in_RDI[1]._finalized;
    local_310._3_1_ = in_RDI[1]._reserved;
    local_310._4_4_ = in_RDI[1]._lastError;
    local_148 = &local_308;
    local_150 = &in_RDI[1]._privateData;
    local_308._0_4_ = in_RDI[1]._privateData;
    local_308._4_4_ = in_RDI[1]._globalHints;
    local_300._0_4_ = in_RDI[1]._globalOptions;
    local_300._4_4_ = in_RDI[1]._options;
  }
  local_30 = &in_RDI->_codeInfo;
  uVar2 = 6;
  ppuVar3 = &local_2f8;
  local_28 = local_30;
  Logging::formatInstruction
            (in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c,in_RDI,in_stack_fffffffffffffc8c,
             in_stack_fffffffffffffc88,(uint32_t)((ulong)ppuVar3 >> 0x20),(Operand_ *)local_1c8[1],
             (Operand_ *)*local_1d0,(uint32_t)local_1d0[1]);
  in_RDI->_options = 0;
  local_18 = &in_RDI->_extraOp;
  local_1c = 0;
  (local_18->field_0)._any.signature = 0;
  in_RDI->_inlineComment = (char *)0x0;
  local_190 = ppuVar3;
  EVar1 = CodeEmitter::setLastError
                    ((CodeEmitter *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                     (Error)((ulong)ppuVar3 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffc7c,uVar2));
  StringBuilderTmp<256UL>::~StringBuilderTmp((StringBuilderTmp<256UL> *)0x10dfbc);
  return EVar1;
}

Assistant:

Error Assembler::_emitFailed(
  Error err,
  uint32_t instId, uint32_t options, const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_& o3) {

  StringBuilderTmp<256> sb;
  sb.appendString(DebugUtils::errorAsString(err));
  sb.appendString(": ");

  Operand_ opArray[6];
  opArray[0].copyFrom(o0);
  opArray[1].copyFrom(o1);
  opArray[2].copyFrom(o2);
  opArray[3].copyFrom(o3);

  if (options & kOptionOp4Op5Used) {
    opArray[4].copyFrom(_op4);
    opArray[5].copyFrom(_op5);
  }
  else {
    opArray[4].reset();
    opArray[5].reset();
  }

  Logging::formatInstruction(
    sb, 0,
    this, getArchType(),
    instId, options, _extraOp, opArray, 6);

  resetOptions();
  resetExtraOp();
  resetInlineComment();
  return setLastError(err, sb.getData());
}